

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O0

bool __thiscall
RTree<int,_double,_2,_double,_8,_4>::AddBranch
          (RTree<int,_double,_2,_double,_8,_4> *this,Branch *a_branch,Node *a_node,Node **a_newNode)

{
  long in_RCX;
  int *in_RDX;
  void *in_RSI;
  Node **in_stack_00000238;
  Branch *in_stack_00000240;
  Node *in_stack_00000248;
  RTree<int,_double,_2,_double,_8,_4> *in_stack_00000250;
  bool local_1;
  
  if (in_RSI == (void *)0x0) {
    __assert_fail("a_branch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                  ,0x425,
                  "bool RTree<int, double, 2>::AddBranch(const Branch *, Node *, Node **) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
                 );
  }
  if (in_RDX != (int *)0x0) {
    if (*in_RDX < 8) {
      memcpy(in_RDX + (long)*in_RDX * 0xc + 2,in_RSI,0x30);
      *in_RDX = *in_RDX + 1;
      local_1 = false;
    }
    else {
      if (in_RCX == 0) {
        __assert_fail("a_newNode",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                      ,0x431,
                      "bool RTree<int, double, 2>::AddBranch(const Branch *, Node *, Node **) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
                     );
      }
      SplitNode(in_stack_00000250,in_stack_00000248,in_stack_00000240,in_stack_00000238);
      local_1 = true;
    }
    return local_1;
  }
  __assert_fail("a_node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                ,0x426,
                "bool RTree<int, double, 2>::AddBranch(const Branch *, Node *, Node **) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
               );
}

Assistant:

RTREE_TEMPLATE
bool RTREE_QUAL::AddBranch(const Branch* a_branch, Node* a_node, Node** a_newNode)
{
  ASSERT(a_branch);
  ASSERT(a_node);

  if(a_node->m_count < MAXNODES)  // Split won't be necessary
  {
    a_node->m_branch[a_node->m_count] = *a_branch;
    ++a_node->m_count;

    return false;
  }
  else
  {
    ASSERT(a_newNode);
    
    SplitNode(a_node, a_branch, a_newNode);
    return true;
  }
}